

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

void __thiscall VcprojGenerator::initLinkerTool(VcprojGenerator *this)

{
  bool bVar1;
  long in_RDI;
  long in_FS_OFFSET;
  ProString *lib;
  ProStringList *__range2;
  int i;
  VCConfiguration *conf;
  const_iterator __end2;
  const_iterator __begin2;
  ProStringList libs;
  ProString *in_stack_fffffffffffffd58;
  QMakeProject *in_stack_fffffffffffffd60;
  ProKey *this_00;
  QString *in_stack_fffffffffffffd68;
  ProString *in_stack_fffffffffffffd70;
  QMakeEvaluator *in_stack_fffffffffffffd78;
  QMakeEvaluator *this_01;
  char *in_stack_fffffffffffffd88;
  ProKey *in_stack_fffffffffffffd90;
  MakefileGenerator *this_02;
  int local_22c;
  undefined1 local_218 [216];
  ProString *local_140;
  const_iterator local_138;
  const_iterator local_130 [7];
  qsizetype local_f8;
  Data *local_f0;
  char16_t *local_e8;
  size_t local_8;
  
  local_8 = *(size_t *)(in_FS_OFFSET + 0x28);
  this_02 = *(MakefileGenerator **)(in_RDI + 0xd8);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
  QMakeProject::values(in_stack_fffffffffffffd60,(ProKey *)in_stack_fffffffffffffd58);
  VCToolBase::parseOptions
            ((VCToolBase *)in_stack_fffffffffffffd78,(ProStringList *)in_stack_fffffffffffffd70);
  ProKey::~ProKey((ProKey *)0x29521c);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
  QMakeProject::values(in_stack_fffffffffffffd60,(ProKey *)in_stack_fffffffffffffd58);
  bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x29525b);
  ProKey::~ProKey((ProKey *)0x29526e);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_fffffffffffffd90 = *(ProKey **)(in_RDI + 0xd8);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
    QMakeEvaluator::first(in_stack_fffffffffffffd78,(ProKey *)in_stack_fffffffffffffd70);
    ProString::toQString(in_stack_fffffffffffffd58);
    QString::operator=((QString *)in_stack_fffffffffffffd60,&in_stack_fffffffffffffd58->m_string);
    QString::~QString((QString *)0x2952ff);
    ProString::~ProString((ProString *)0x29530c);
    ProKey::~ProKey((ProKey *)0x295319);
  }
  for (local_22c = 0; initLinkerTool::lflags[local_22c] != (char *)0x0; local_22c = local_22c + 1) {
    local_f8 = -0x5555555555555556;
    local_f0 = (Data *)0xaaaaaaaaaaaaaaaa;
    local_e8 = (char16_t *)0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
    MakefileGenerator::fixLibFlags(this_02,in_stack_fffffffffffffd90);
    ProKey::~ProKey((ProKey *)0x2953a9);
    local_130[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_130[0] = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffffd60);
    local_138.i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_138 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffffd60);
    while( true ) {
      local_140 = local_138.i;
      bVar1 = QList<ProString>::const_iterator::operator!=(local_130,local_138);
      if (!bVar1) break;
      QList<ProString>::const_iterator::operator*(local_130);
      bVar1 = ProString::startsWith
                        (in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,
                         (CaseSensitivity)((ulong)in_stack_fffffffffffffd60 >> 0x20));
      if (bVar1) {
        in_stack_fffffffffffffd88 = (char *)(in_RDI + 0x6c0);
        ProString::mid((ProString *)in_stack_fffffffffffffd78,
                       (int)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                       (int)in_stack_fffffffffffffd70);
        ProString::toQString(in_stack_fffffffffffffd58);
        QList<QString>::operator<<
                  ((QList<QString> *)in_stack_fffffffffffffd60,&in_stack_fffffffffffffd58->m_string)
        ;
        QString::~QString((QString *)0x2954d9);
        ProString::~ProString((ProString *)0x2954e6);
      }
      else {
        ProString::toQString(in_stack_fffffffffffffd58);
        QList<QString>::operator<<
                  ((QList<QString> *)in_stack_fffffffffffffd60,&in_stack_fffffffffffffd58->m_string)
        ;
        QString::~QString((QString *)0x295530);
      }
      QList<ProString>::const_iterator::operator++(local_130);
    }
    ProStringList::~ProStringList((ProStringList *)0x295551);
  }
  QString::operator=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd88);
  this_00 = *(ProKey **)(in_RDI + 0xd8);
  this_01 = (QMakeEvaluator *)local_218;
  ProKey::ProKey(this_00,(char *)in_stack_fffffffffffffd58);
  QMakeEvaluator::first(this_01,(ProKey *)(local_218 + 0x30));
  ProString::toQString(in_stack_fffffffffffffd58);
  QString::operator+=((QString *)this_00,&in_stack_fffffffffffffd58->m_string);
  QString::~QString((QString *)0x2955fc);
  ProString::~ProString((ProString *)0x295606);
  ProKey::~ProKey((ProKey *)0x295610);
  if (*(size_t *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VcprojGenerator::initLinkerTool()
{
    VCConfiguration &conf = vcProject.Configuration;
    conf.linker.parseOptions(project->values("QMAKE_LFLAGS"));

    if (!project->values("DEF_FILE").isEmpty())
        conf.linker.ModuleDefinitionFile = project->first("DEF_FILE").toQString();

    static const char * const lflags[] = { "LIBS", "LIBS_PRIVATE",
                                           "QMAKE_LIBS", "QMAKE_LIBS_PRIVATE", nullptr };
    for (int i = 0; lflags[i]; i++) {
        const auto libs = fixLibFlags(lflags[i]);
        for (const ProString &lib : libs) {
            if (lib.startsWith("/LIBPATH:"))
                conf.linker.AdditionalLibraryDirectories << lib.mid(9).toQString();
            else
                conf.linker.AdditionalDependencies << lib.toQString();
        }
    }

    conf.linker.OutputFile = "$(OutDir)\\";
    conf.linker.OutputFile += project->first("MSVCPROJ_TARGET").toQString();
}